

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::
OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
::Matches(OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_>
  *in_RDI;
  tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
  *in_stack_00000008;
  MatcherBase<const_std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_&>
  *in_stack_00000010;
  tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
  *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>>,std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_&>
               ::Matches(in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }